

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

bool __thiscall wasm::anon_unknown_0::SubTyper::isSubType(SubTyper *this,Type a,Type b)

{
  bool bVar1;
  Tuple *a_00;
  Tuple *b_00;
  HeapType local_40;
  HeapType heapTypeB;
  HeapType heapTypeA;
  SubTyper *this_local;
  Type b_local;
  Type a_local;
  
  this_local = (SubTyper *)b.id;
  b_local = a;
  bVar1 = wasm::Type::operator==(&b_local,(Type *)&this_local);
  if (bVar1) {
    a_local.id._7_1_ = true;
  }
  else {
    heapTypeA.id._4_4_ = 1;
    bVar1 = wasm::Type::operator==(&b_local,(BasicType *)((long)&heapTypeA.id + 4));
    if (bVar1) {
      a_local.id._7_1_ = true;
    }
    else {
      bVar1 = wasm::Type::isTuple(&b_local);
      if ((bVar1) && (bVar1 = wasm::Type::isTuple((Type *)&this_local), bVar1)) {
        a_00 = wasm::Type::getTuple(&b_local);
        b_00 = wasm::Type::getTuple((Type *)&this_local);
        a_local.id._7_1_ = isSubType(this,a_00,b_00);
      }
      else {
        bVar1 = wasm::Type::isRef(&b_local);
        if ((bVar1) && (bVar1 = wasm::Type::isRef((Type *)&this_local), bVar1)) {
          bVar1 = wasm::Type::isNullable(&b_local);
          if ((!bVar1) || (bVar1 = wasm::Type::isNullable((Type *)&this_local), bVar1)) {
            heapTypeB = wasm::Type::getHeapType(&b_local);
            local_40 = wasm::Type::getHeapType((Type *)&this_local);
            bVar1 = wasm::Type::isExact((Type *)&this_local);
            if (bVar1) {
              bVar1 = wasm::Type::isExact(&b_local);
              if (bVar1) {
                bVar1 = HeapType::operator==(&heapTypeB,&local_40);
                return bVar1;
              }
              bVar1 = HeapType::isBottom(&heapTypeB);
              if (!bVar1) {
                return false;
              }
            }
            a_local.id._7_1_ = isSubType(this,heapTypeB,local_40);
          }
          else {
            a_local.id._7_1_ = false;
          }
        }
        else {
          a_local.id._7_1_ = false;
        }
      }
    }
  }
  return a_local.id._7_1_;
}

Assistant:

bool SubTyper::isSubType(Type a, Type b) {
  if (a == b) {
    return true;
  }
  if (a == Type::unreachable) {
    return true;
  }
  if (a.isTuple() && b.isTuple()) {
    return isSubType(a.getTuple(), b.getTuple());
  }
  if (!a.isRef() || !b.isRef()) {
    return false;
  }
  if (a.isNullable() && !b.isNullable()) {
    return false;
  }
  auto heapTypeA = a.getHeapType();
  auto heapTypeB = b.getHeapType();
  if (b.isExact()) {
    if (a.isExact()) {
      return heapTypeA == heapTypeB;
    }
    if (!heapTypeA.isBottom()) {
      return false;
    }
  }
  return isSubType(heapTypeA, heapTypeB);
}